

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_ext(lysp_ctx *ctx,lysp_stmt *stmt,ly_stmt insubstmt,uint64_t insubstmt_index,
                    lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  lysp_ext_instance *str_p;
  ly_ctx *local_78;
  ly_ctx *local_70;
  ly_ctx *local_68;
  ly_ctx *local_60;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  lysp_ext_instance *e;
  lysp_ext_instance **exts_local;
  uint64_t insubstmt_index_local;
  ly_stmt insubstmt_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  if (*exts == (lysp_ext_instance *)0x0) {
    _ret___1 = (undefined8 *)malloc(0x78);
    if (_ret___1 == (undefined8 *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_68 = (ly_ctx *)0x0;
      }
      else {
        local_68 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_68,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_ext");
      return LY_EMEM;
    }
    *_ret___1 = 1;
  }
  else {
    (*exts)[-1].exts = (lysp_ext_instance *)((long)&((*exts)[-1].exts)->name + 1);
    _ret___1 = (undefined8 *)realloc(&(*exts)[-1].exts,(long)(*exts)[-1].exts * 0x70 + 8);
    if (_ret___1 == (undefined8 *)0x0) {
      (*exts)[-1].exts = (lysp_ext_instance *)((long)&(*exts)[-1].exts[-1].exts + 7);
      if (ctx == (lysp_ctx *)0x0) {
        local_60 = (ly_ctx *)0x0;
      }
      else {
        local_60 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_60,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_ext");
      return LY_EMEM;
    }
  }
  *exts = (lysp_ext_instance *)(_ret___1 + 1);
  str_p = *exts + (long)((long)&(*exts)[-1].exts[-1].exts + 7);
  memset(str_p,0,0x70);
  if (ctx == (lysp_ctx *)0x0) {
    local_70 = (ly_ctx *)0x0;
  }
  else {
    local_70 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ctx_local._4_4_ = lydict_insert(local_70,stmt->stmt,0,&str_p->name);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    str_p->parent_stmt = insubstmt;
    str_p->parent_stmt_index = insubstmt_index;
    str_p->parsed = (void *)0x0;
    ctx_local._4_4_ = lysp_stmt_dup(ctx,stmt->child,&str_p->child);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      if (stmt->arg != (char *)0x0) {
        if (ctx == (lysp_ctx *)0x0) {
          local_78 = (ly_ctx *)0x0;
        }
        else {
          local_78 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar1 = lydict_insert(local_78,stmt->arg,0,&str_p->argument);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_ext(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, enum ly_stmt insubstmt,
        LY_ARRAY_COUNT_TYPE insubstmt_index, struct lysp_ext_instance **exts)
{
    struct lysp_ext_instance *e;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *exts, e, LY_EMEM);

    /* store name and insubstmt info */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->stmt, 0, &e->name));
    e->parent_stmt = insubstmt;
    e->parent_stmt_index = insubstmt_index;
    e->parsed = NULL;
    LY_CHECK_RET(lysp_stmt_dup(ctx, stmt->child, &e->child));

    /* get optional argument */
    if (stmt->arg) {
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &e->argument));
    }

    return LY_SUCCESS;
}